

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void Assimp::FBX::ResolveVertexDataArray<aiColor4t<float>>
               (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *data_out,Scope *source
               ,string *MappingInformationType,string *ReferenceInformationType,
               char *dataElementName,char *indexDataElementName,size_t vertex_count,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_counts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_offsets,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mappings)

{
  uint uVar1;
  pointer paVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer paVar5;
  pointer paVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  Element *pEVar12;
  pointer piVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  string *psVar17;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> tempData_1;
  vector<int,_std::allocator<int>_> uvIndices;
  allocator<char> local_22a;
  allocator<char> local_229;
  string local_228;
  string local_208;
  _Vector_base<int,_std::allocator<int>_> local_1e8;
  char *local_1c8;
  char *local_1c0;
  string *local_1b8;
  string *local_1b0;
  format local_1a8;
  
  local_1c8 = dataElementName;
  local_1b0 = MappingInformationType;
  bVar8 = std::operator==(ReferenceInformationType,"Direct");
  bVar9 = std::operator==(ReferenceInformationType,"IndexToDirect");
  local_1c0 = indexDataElementName;
  local_1b8 = ReferenceInformationType;
  if (bVar9) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,indexDataElementName,(allocator<char> *)&local_228);
    bVar10 = HasElement(source,(string *)&local_1a8);
    bVar10 = !bVar10;
    std::__cxx11::string::~string((string *)&local_1a8);
    bVar9 = bVar10;
  }
  else {
    bVar9 = true;
    bVar10 = false;
  }
  psVar17 = local_1b0;
  bVar11 = std::operator==(local_1b0,"ByVertice");
  pcVar7 = local_1c8;
  if (((bVar8 | bVar10) == 1) && (bVar11)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,local_1c8,(allocator<char> *)&local_228);
    bVar8 = HasElement(source,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if (!bVar8) {
      return;
    }
    local_228._M_dataplus._M_p = (pointer)0x0;
    local_228._M_string_length = 0;
    local_228.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,pcVar7,(allocator<char> *)&local_208);
    pEVar12 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
    ParseVectorDataArray
              ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&local_228,pEVar12);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize(data_out,vertex_count)
    ;
    for (lVar14 = 0;
        lVar14 != (long)(local_228._M_string_length - (long)local_228._M_dataplus._M_p) >> 4;
        lVar14 = lVar14 + 1) {
      uVar15 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start[lVar14];
      uVar1 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start[lVar14];
      for (uVar16 = (ulong)uVar15; uVar16 < uVar1 + uVar15; uVar16 = uVar16 + 1) {
        uVar3 = *(undefined8 *)(local_228._M_dataplus._M_p + lVar14 * 0x10);
        uVar4 = *(undefined8 *)(local_228._M_dataplus._M_p + lVar14 * 0x10 + 8);
        paVar2 = (data_out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start +
                 (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start[uVar16];
        paVar2->r = (float)(int)uVar3;
        paVar2->g = (float)(int)((ulong)uVar3 >> 0x20);
        paVar2->b = (float)(int)uVar4;
        paVar2->a = (float)(int)((ulong)uVar4 >> 0x20);
      }
    }
LAB_0052e288:
    psVar17 = &local_228;
  }
  else {
    bVar11 = std::operator==(psVar17,"ByVertice");
    if (bVar11 && !bVar9) {
      local_208._M_dataplus._M_p = (pointer)0x0;
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,local_1c8,(allocator<char> *)&local_228);
      pEVar12 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
      ParseVectorDataArray
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&local_208,pEVar12)
      ;
      std::__cxx11::string::~string((string *)&local_1a8);
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
                (data_out,vertex_count);
      local_1e8._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
      local_1e8._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
      local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,local_1c0,(allocator<char> *)&local_228);
      pEVar12 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
      ParseVectorDataArray((vector<int,_std::allocator<int>_> *)&local_1e8,pEVar12);
      std::__cxx11::string::~string((string *)&local_1a8);
      for (lVar14 = 0;
          lVar14 != (long)local_1e8._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1e8._M_impl.super__Vector_impl_data._M_start >> 2;
          lVar14 = lVar14 + 1) {
        uVar15 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar14];
        uVar1 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar14];
        for (uVar16 = (ulong)uVar15; uVar16 < uVar1 + uVar15; uVar16 = uVar16 + 1) {
          if ((ulong)((long)(local_208._M_string_length - (long)local_208._M_dataplus._M_p) >> 4) <=
              (ulong)(long)local_1e8._M_impl.super__Vector_impl_data._M_start[lVar14]) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a8,"index out of range",&local_229);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_228,local_1c0,&local_22a);
            pEVar12 = GetRequiredElement(source,&local_228,(Element *)0x0);
            Util::DOMError((string *)&local_1a8,pEVar12);
          }
          uVar3 = *(undefined8 *)
                   (local_208._M_dataplus._M_p +
                   (long)local_1e8._M_impl.super__Vector_impl_data._M_start[lVar14] * 0x10);
          uVar4 = *(undefined8 *)
                   (local_208._M_dataplus._M_p +
                    (long)local_1e8._M_impl.super__Vector_impl_data._M_start[lVar14] * 0x10 + 8);
          paVar2 = (data_out->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_start +
                   (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar16];
          paVar2->r = (float)(int)uVar3;
          paVar2->g = (float)(int)((ulong)uVar3 >> 0x20);
          paVar2->b = (float)(int)uVar4;
          paVar2->a = (float)(int)((ulong)uVar4 >> 0x20);
        }
      }
    }
    else {
      bVar11 = std::operator==(psVar17,"ByPolygonVertex");
      if (((bVar8 | bVar10) & bVar11) == 1) {
        local_228._M_dataplus._M_p = (pointer)0x0;
        local_228._M_string_length = 0;
        local_228.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,local_1c8,(allocator<char> *)&local_208);
        pEVar12 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
        ParseVectorDataArray
                  ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&local_228,
                   pEVar12);
        std::__cxx11::string::~string((string *)&local_1a8);
        if ((long)(local_228._M_string_length - (long)local_228._M_dataplus._M_p) >> 4 ==
            vertex_count) {
          paVar2 = (data_out->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
          (data_out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_228.field_2._M_allocated_capacity;
          paVar5 = (data_out->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          paVar6 = (data_out->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
          (data_out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_228._M_dataplus._M_p;
          (data_out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._M_string_length;
          local_228._M_dataplus._M_p = (pointer)paVar5;
          local_228._M_string_length = (size_type)paVar6;
          local_228.field_2._M_allocated_capacity = (size_type)paVar2;
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    (&local_1a8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::operator<<((ostream *)&local_1a8,", expected ");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          LogFunctions<Assimp::FBXImporter>::LogError(&local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        }
        goto LAB_0052e288;
      }
      bVar8 = std::operator==(psVar17,"ByPolygonVertex");
      if (bVar9 || !bVar8) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[60]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_1a8,
                   (char (*) [60])"ignoring vertex data channel, access type not implemented: ");
        std::operator<<((ostream *)&local_1a8,(string *)psVar17);
        std::operator<<((ostream *)&local_1a8,",");
        std::operator<<((ostream *)&local_1a8,(string *)local_1b8);
        LogFunctions<Assimp::FBXImporter>::LogError(&local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        return;
      }
      local_208._M_dataplus._M_p = (pointer)0x0;
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,local_1c8,(allocator<char> *)&local_228);
      pEVar12 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
      pcVar7 = local_1c0;
      ParseVectorDataArray
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&local_208,pEVar12)
      ;
      std::__cxx11::string::~string((string *)&local_1a8);
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
                (data_out,vertex_count);
      local_1e8._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
      local_1e8._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
      local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,pcVar7,(allocator<char> *)&local_228);
      pEVar12 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
      ParseVectorDataArray((vector<int,_std::allocator<int>_> *)&local_1e8,pEVar12);
      std::__cxx11::string::~string((string *)&local_1a8);
      if ((long)local_1e8._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1e8._M_impl.super__Vector_impl_data._M_start >> 2 == vertex_count) {
        uVar15 = 0;
        for (piVar13 = local_1e8._M_impl.super__Vector_impl_data._M_start;
            piVar13 != local_1e8._M_impl.super__Vector_impl_data._M_finish; piVar13 = piVar13 + 1) {
          uVar16 = (ulong)*piVar13;
          if (uVar16 == 0xffffffffffffffff) {
            paVar2 = (data_out->
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start + uVar15;
            paVar2->r = 0.0;
            paVar2->g = 0.0;
            paVar2->b = 0.0;
            paVar2->a = 0.0;
          }
          else {
            if ((ulong)((long)(local_208._M_string_length - (long)local_208._M_dataplus._M_p) >> 4)
                <= uVar16) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a8,"index out of range",&local_229);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_228,pcVar7,&local_22a);
              pEVar12 = GetRequiredElement(source,&local_228,(Element *)0x0);
              Util::DOMError((string *)&local_1a8,pEVar12);
            }
            uVar3 = *(undefined8 *)(local_208._M_dataplus._M_p + uVar16 * 0x10);
            uVar4 = *(undefined8 *)(local_208._M_dataplus._M_p + uVar16 * 0x10 + 8);
            paVar2 = (data_out->
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start + uVar15;
            paVar2->r = (float)(int)uVar3;
            paVar2->g = (float)(int)((ulong)uVar3 >> 0x20);
            paVar2->b = (float)(int)uVar4;
            paVar2->a = (float)(int)((ulong)uVar4 >> 0x20);
          }
          uVar15 = uVar15 + 1;
        }
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x52e29b);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1e8);
    psVar17 = &local_208;
  }
  std::_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~_Vector_base
            ((_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)psVar17);
  return;
}

Assistant:

void ResolveVertexDataArray(std::vector<T>& data_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType,
    const char* dataElementName,
    const char* indexDataElementName,
    size_t vertex_count,
    const std::vector<unsigned int>& mapping_counts,
    const std::vector<unsigned int>& mapping_offsets,
    const std::vector<unsigned int>& mappings)
{
    bool isDirect = ReferenceInformationType == "Direct";
    bool isIndexToDirect = ReferenceInformationType == "IndexToDirect";

    // fall-back to direct data if there is no index data element
    if ( isIndexToDirect && !HasElement( source, indexDataElementName ) ) {
        isDirect = true;
        isIndexToDirect = false;
    }

    // handle permutations of Mapping and Reference type - it would be nice to
    // deal with this more elegantly and with less redundancy, but right
    // now it seems unavoidable.
    if (MappingInformationType == "ByVertice" && isDirect) {
        if (!HasElement(source, dataElementName)) {
            return;
        }
        std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);
		for (size_t i = 0, e = tempData.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				data_out[mappings[j]] = tempData[i];
            }
        }
    }
    else if (MappingInformationType == "ByVertice" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));
        for (size_t i = 0, e = uvIndices.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				if (static_cast<size_t>(uvIndices[i]) >= tempData.size()) {
                    DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
                }
				data_out[mappings[j]] = tempData[uvIndices[i]];
            }
        }
    }
    else if (MappingInformationType == "ByPolygonVertex" && isDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

		if (tempData.size() != vertex_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
				<< tempData.size() << ", expected " << vertex_count
            );
            return;
        }

		data_out.swap(tempData);
    }
    else if (MappingInformationType == "ByPolygonVertex" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));

        if (uvIndices.size() != vertex_count) {
            FBXImporter::LogError("length of input data unexpected for ByPolygonVertex mapping");
            return;
        }

        const T empty;
        unsigned int next = 0;
        for(int i : uvIndices) {
            if ( -1 == i ) {
                data_out[ next++ ] = empty;
                continue;
            }
            if (static_cast<size_t>(i) >= tempData.size()) {
                DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
            }

			data_out[next++] = tempData[i];
        }
    }
    else {
        FBXImporter::LogError(Formatter::format("ignoring vertex data channel, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}